

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufPrintOne(Buf_Man_t *p,int iPivot)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFan;
  uint uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  if (-1 < iPivot) {
    pVVar2 = p->pNtk->vObjs;
    if (iPivot < pVVar2->nSize) {
      pObj = (Abc_Obj_t *)pVVar2->pArray[(uint)iPivot];
      pVVar4 = Abc_BufSortByDelay(p,iPivot);
      printf("Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {",(ulong)(uint)iPivot,
             (ulong)(uint)(pObj->vFanins).nSize,(ulong)(uint)(pObj->vFanouts).nSize,
             (ulong)(*(uint *)&pObj->field_0x14 >> 0xc));
      if (0 < pVVar4->nSize) {
        lVar5 = 0;
        do {
          iVar1 = pVVar4->pArray[lVar5];
          if (((long)iVar1 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar1))
          goto LAB_003dc387;
          pFan = (Abc_Obj_t *)pVVar2->pArray[iVar1];
          if (pFan != (Abc_Obj_t *)0x0) {
            uVar3 = Abc_BufEdgeSlack(p,pObj,pFan);
            printf(" %d(%d)",(ulong)(uint)pFan->Id,(ulong)uVar3);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < pVVar4->nSize);
      }
      puts(" }");
      return;
    }
  }
LAB_003dc387:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_BufPrintOne( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    Vec_Int_t * vOrder;
    int i, Slack;
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    vOrder = Abc_BufSortByDelay( p, iPivot );
    printf( "Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {", iPivot, Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), Abc_ObjLevel(pObj) );
    Abc_NtkForEachObjVec( vOrder, p->pNtk, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack( p, pObj, pFanout );
        printf( " %d(%d)", Abc_ObjId(pFanout), Slack );
    }
    printf( " }\n" );
}